

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

EC_GROUP * EC_KEY_parse_parameters(CBS *cbs)

{
  CBS *out;
  int iVar1;
  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true> p_00;
  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true> a_00;
  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true> b_00;
  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true> x_00;
  tuple<bignum_st_*,_bssl::internal::Deleter> y_00;
  EC_GROUP *pEVar2;
  BIGNUM *bn;
  EC_POINT *p_01;
  undefined4 uVar3;
  uint8_t *puVar4;
  int line;
  long lVar5;
  EC_GROUP *pEVar6;
  undefined1 auVar7 [16];
  uint8_t local_129;
  UniquePtr<BIGNUM> p;
  size_t local_120;
  int has_cofactor;
  UniquePtr<BIGNUM> x;
  size_t local_100;
  UniquePtr<BIGNUM> y;
  ulong local_d0;
  UniquePtr<BIGNUM> a;
  size_t local_c0;
  UniquePtr<BIGNUM> b;
  size_t local_b0;
  uint64_t version;
  CBS cofactor;
  explicit_prime_curve curve;
  
  iVar1 = CBS_peek_asn1_tag(cbs,0x20000010);
  if (iVar1 == 0) {
    pEVar2 = EC_KEY_parse_curve_name(cbs);
    return pEVar2;
  }
  iVar1 = CBS_get_asn1(cbs,(CBS *)&p,0x20000010);
  if (((((iVar1 != 0) && (iVar1 = CBS_get_asn1_uint64((CBS *)&p,&version), iVar1 != 0)) &&
       (version == 1)) &&
      ((((iVar1 = CBS_get_asn1((CBS *)&p,(CBS *)&a,0x20000010), iVar1 != 0 &&
         (iVar1 = CBS_get_asn1((CBS *)&a,(CBS *)&b,6), iVar1 != 0)) &&
        ((local_b0 == 7 &&
         ((iVar1 = bcmp((void *)b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,kPrimeField,7
                       ), iVar1 == 0 && (iVar1 = CBS_get_asn1((CBS *)&a,&curve.prime,2), iVar1 != 0)
          ))))) && (iVar1 = CBS_is_unsigned_asn1_integer(&curve.prime), iVar1 != 0)))) &&
     ((local_c0 == 0 && (iVar1 = CBS_get_asn1((CBS *)&p,(CBS *)&x,0x20000010), iVar1 != 0)))) {
    iVar1 = CBS_get_asn1((CBS *)&x,&curve.a,4);
    if (iVar1 != 0) {
      iVar1 = CBS_get_asn1((CBS *)&x,&curve.b,4);
      if ((((iVar1 != 0) &&
           (iVar1 = CBS_get_optional_asn1((CBS *)&x,(CBS *)0x0,(int *)0x0,3), iVar1 != 0)) &&
          (local_100 == 0)) && (iVar1 = CBS_get_asn1((CBS *)&p,(CBS *)&y,4), iVar1 != 0)) {
        out = &curve.order;
        iVar1 = CBS_get_asn1((CBS *)&p,out,2);
        if (((iVar1 != 0) && (iVar1 = CBS_is_unsigned_asn1_integer(out), iVar1 != 0)) &&
           ((iVar1 = CBS_get_optional_asn1((CBS *)&p,&cofactor,&has_cofactor,2), iVar1 != 0 &&
            (local_120 == 0)))) {
          if ((has_cofactor == 0) || ((cofactor.len == 1 && (*cofactor.data == '\x01')))) {
            iVar1 = CBS_get_u8((CBS *)&y,&local_129);
            if ((iVar1 == 0) || (local_129 != '\x04')) {
              iVar1 = 0x6f;
              line = 0x104;
            }
            else {
              if ((local_d0 & 1) == 0) {
                curve.base_x.len = local_d0 >> 1;
                curve.base_x.data =
                     (uint8_t *)
                     y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
                puVar4 = (uint8_t *)
                         ((long)y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl +
                         curve.base_x.len);
                curve.base_y.data = puVar4;
                curve.base_y.len = curve.base_x.len;
                p_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)BN_new();
                uVar3 = SUB84(puVar4,0);
                p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     p_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
                a_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)BN_new();
                a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     a_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
                b_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)BN_new();
                b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     b_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
                x_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)BN_new();
                x._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     x_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
                y_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>)BN_new();
                auVar7._0_4_ = -(uint)(p_00.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_
                                       == 0 && (int)p_00.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl == 0);
                auVar7._4_4_ = -(uint)((int)a_00.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                       == 0 && a_00.
                                               super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_bignum_st_*,_false>.
                                               _M_head_impl._4_4_ == 0);
                auVar7._8_4_ = -(uint)(b_00.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_
                                       == 0 && (int)b_00.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl == 0);
                auVar7._12_4_ =
                     -(uint)((int)x_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl == 0 &&
                            x_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ == 0);
                iVar1 = movmskps(uVar3,auVar7);
                y._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
                     y_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
                if (iVar1 == 0 &&
                    y_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                    (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
                  lVar5 = 0;
                  do {
                    if (lVar5 == 0x20) goto LAB_0017c024;
                    pEVar2 = (EC_GROUP *)(**(code **)((long)kAllGroups + lVar5))();
                    bn = EC_GROUP_get0_order(pEVar2);
                    iVar1 = integers_equal(out,bn);
                    lVar5 = lVar5 + 8;
                  } while (iVar1 == 0);
                  iVar1 = EC_GROUP_get_curve_GFp
                                    ((EC_GROUP *)pEVar2,
                                     (BIGNUM *)
                                     p_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                     (BIGNUM *)
                                     a_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                     (BIGNUM *)
                                     b_00.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                     (BN_CTX *)0x0);
                  pEVar6 = (EC_GROUP *)0x0;
                  if (iVar1 != 0) {
                    iVar1 = integers_equal(&curve.prime,
                                           (BIGNUM *)
                                           p_00.
                                           super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                    if (((iVar1 != 0) &&
                        (iVar1 = integers_equal(&curve.a,(BIGNUM *)
                                                         a_00.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl), iVar1 != 0)) &&
                       (iVar1 = integers_equal(&curve.b,(BIGNUM *)
                                                        b_00.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl), iVar1 != 0)) {
                      p_01 = EC_GROUP_get0_generator((EC_GROUP *)pEVar2);
                      iVar1 = EC_POINT_get_affine_coordinates_GFp
                                        ((EC_GROUP *)pEVar2,p_01,
                                         (BIGNUM *)
                                         x_00.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                         (BIGNUM *)
                                         y_00.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                         (BN_CTX *)0x0);
                      pEVar6 = (EC_GROUP *)0x0;
                      if ((iVar1 == 0) ||
                         ((iVar1 = integers_equal(&curve.base_x,
                                                  (BIGNUM *)
                                                  x_00.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl), iVar1 != 0 &&
                          (iVar1 = integers_equal(&curve.base_y,
                                                  (BIGNUM *)
                                                  y_00.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl), pEVar6 = pEVar2, iVar1 != 0))))
                      goto LAB_0017c041;
                    }
LAB_0017c024:
                    pEVar6 = (EC_GROUP *)0x0;
                    ERR_put_error(0xf,0,0x7b,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                                  ,0x179);
                  }
                }
                else {
                  pEVar6 = (EC_GROUP *)0x0;
                }
LAB_0017c041:
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&y);
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&x);
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&b);
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&a);
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&p);
                return pEVar6;
              }
              iVar1 = 0x80;
              line = 0x109;
            }
          }
          else {
            iVar1 = 0x7b;
            line = 0xfc;
          }
          goto LAB_0017bc60;
        }
      }
    }
  }
  iVar1 = 0x80;
  line = 0xf4;
LAB_0017bc60:
  ERR_put_error(0xf,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                ,line);
  return (EC_GROUP *)0x0;
}

Assistant:

EC_GROUP *EC_KEY_parse_parameters(CBS *cbs) {
  if (!CBS_peek_asn1_tag(cbs, CBS_ASN1_SEQUENCE)) {
    return EC_KEY_parse_curve_name(cbs);
  }

  // OpenSSL sometimes produces ECPrivateKeys with explicitly-encoded versions
  // of named curves.
  //
  // TODO(davidben): Remove support for this.
  struct explicit_prime_curve curve;
  if (!parse_explicit_prime_curve(cbs, &curve)) {
    return nullptr;
  }

  bssl::UniquePtr<BIGNUM> p(BN_new());
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> x(BN_new());
  bssl::UniquePtr<BIGNUM> y(BN_new());
  if (p == nullptr || a == nullptr || b == nullptr || x == nullptr ||
      y == nullptr) {
    return nullptr;
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kAllGroups); i++) {
    const EC_GROUP *group = kAllGroups[i]();
    if (!integers_equal(&curve.order, EC_GROUP_get0_order(group))) {
      continue;
    }

    // The order alone uniquely identifies the group, but we check the other
    // parameters to avoid misinterpreting the group.
    if (!EC_GROUP_get_curve_GFp(group, p.get(), a.get(), b.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.prime, p.get()) ||
        !integers_equal(&curve.a, a.get()) ||
        !integers_equal(&curve.b, b.get())) {
      break;
    }
    if (!EC_POINT_get_affine_coordinates_GFp(
            group, EC_GROUP_get0_generator(group), x.get(), y.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.base_x, x.get()) ||
        !integers_equal(&curve.base_y, y.get())) {
      break;
    }
    return const_cast<EC_GROUP *>(group);
  }

  OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
  return nullptr;
}